

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  FlatAllocator *descriptor;
  Descriptor *proto_00;
  bool bVar1;
  unsigned_short uVar2;
  SymbolVisibility SVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  string *psVar9;
  DescriptorNames DVar10;
  pointer pTVar11;
  pointer prVar12;
  FieldDescriptorProto *pFVar13;
  PointerT<google::protobuf::ExtensionRangeOptions> pEVar14;
  OneofDescriptorProto *proto_01;
  PointerT<google::protobuf::EnumValueOptions> pEVar15;
  EnumDescriptor *pEVar16;
  EnumDescriptorProto *proto_02;
  PointerT<google::protobuf::MethodOptions> pMVar17;
  DescriptorProto_ExtensionRange *pDVar18;
  PointerT<google::protobuf::FileOptions> pFVar19;
  ReservedRange *pRVar20;
  DescriptorProto_ReservedRange *pDVar21;
  Descriptor *pDVar22;
  DescriptorProto *proto_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar23;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  pMVar24;
  string_view sVar25;
  anon_class_16_2_65e56138_conflict local_368;
  VoidPtr local_358;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_350;
  string_view local_348;
  ExtensionRange *local_338;
  ExtensionRange *range2_2;
  undefined1 auStack_328 [4];
  int j_4;
  ReservedRange **local_320;
  VoidPtr local_318;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_310;
  string_view local_308;
  ReservedRange *local_2f8;
  ReservedRange *range2_1;
  ExtensionRange *pEStack_2e8;
  int j_3;
  ExtensionRange *range1_1;
  anon_class_8_1_a7e8901a aStack_2d8;
  int i_11;
  VoidPtr local_2d0;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_2c8;
  string_view local_2c0;
  string_view local_2b0;
  anon_class_8_1_a7e8901a local_2a0;
  VoidPtr local_298;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_290;
  string_view local_288;
  ReservedRange *local_278;
  ReservedRange *range_1;
  undefined1 auStack_268 [4];
  int j_2;
  FieldDescriptor **local_260;
  VoidPtr local_258;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_250;
  string_view local_248;
  ExtensionRange *local_238;
  ExtensionRange *range;
  FieldDescriptor *pFStack_228;
  int j_1;
  FieldDescriptor *field;
  anon_class_8_1_898f2789 aStack_218;
  int i_10;
  VoidPtr local_210;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_208;
  string_view local_200;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
  local_1f0;
  reference local_1d8;
  string *name;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  VoidPtr local_188;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_180;
  string_view local_178;
  MaybeInitializedPtr local_168;
  DescriptorProto_ReservedRange *range2;
  DescriptorProto_ReservedRange *pDStack_158;
  int j;
  DescriptorProto_ReservedRange *range1;
  Symbol SStack_148;
  int i_9;
  string_view local_140;
  string_view local_130;
  int local_11c;
  int local_118;
  int i_8;
  int reserved_name_count;
  int i_7;
  string_view local_100;
  IncrementWhenDestroyed local_f0;
  IncrementWhenDestroyed revert;
  int local_d4;
  int local_d0;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string_view local_a8;
  undefined1 local_98 [8];
  iterator it;
  undefined1 local_40 [8];
  string_view scope;
  FlatAllocator *alloc_local;
  Descriptor *result_local;
  Descriptor *parent_local;
  DescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  alloc_local = (FlatAllocator *)result;
  result_local = parent;
  parent_local = (Descriptor *)proto;
  proto_local = (DescriptorProto *)this;
  if (parent == (Descriptor *)0x0) {
    _local_40 = FileDescriptor::package(this->file_);
  }
  else {
    _local_40 = Descriptor::full_name(parent);
  }
  psVar9 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  sVar25 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
  DVar10 = AllocateNameStrings(this,_local_40,sVar25,(Message *)parent_local,alloc);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       (PointerT<google::protobuf::SourceCodeInfo>)DVar10.payload_;
  psVar9 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)parent_local);
  sVar25 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
  join_0x00000010_0x00000000_ = Descriptor::full_name((Descriptor *)alloc_local);
  ValidateSymbolName(this,sVar25,join_0x00000010_0x00000000_,(Message *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
       (PointerT<google::protobuf::FileDescriptorTables>)this->file_;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FeatureSet>.value =
       (PointerT<google::protobuf::FeatureSet>)result_local;
  *(ushort *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 1) =
       *(ushort *)
        ((long)&(alloc_local->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).pointers_.payload_.super_Base<char>.value + 1) & 0xfffe;
  *(ushort *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 1) =
       *(ushort *)
        ((long)&(alloc_local->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).pointers_.payload_.super_Base<char>.value + 1) & 0xfffd;
  *(ushort *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 1) =
       *(ushort *)
        ((long)&(alloc_local->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).pointers_.payload_.super_Base<char>.value + 1) & 0xff83;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::MessageOptions>.value =
       (PointerT<google::protobuf::MessageOptions>)0x0;
  SVar3 = DescriptorProto::visibility((DescriptorProto *)parent_local);
  *(ushort *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 1) =
       *(ushort *)
        ((long)&(alloc_local->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).pointers_.payload_.super_Base<char>.value + 1) & 0xfcff | ((byte)SVar3 & 3) << 8;
  pTVar11 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->pool_->tables_);
  local_a8 = Descriptor::full_name((Descriptor *)alloc_local);
  _local_98 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
              ::find<std::basic_string_view<char,std::char_traits<char>>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                          *)&pTVar11->well_known_types_,&local_a8);
  pTVar11 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->pool_->tables_);
  _i_1 = absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
         ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
                *)&pTVar11->well_known_types_);
  bVar1 = absl::lts_20250127::container_internal::operator!=((iterator *)local_98,(iterator *)&i_1);
  if (bVar1) {
    prVar12 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              ::iterator::operator->((iterator *)local_98);
    *(ushort *)
     ((long)&(alloc_local->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<char>.value + 1) =
         *(ushort *)
          ((long)&(alloc_local->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ).pointers_.payload_.super_Base<char>.value + 1) & 0xff83 |
         ((byte)prVar12->second & 0x1f) << 2;
  }
  *(undefined2 *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 4) = 0;
  i_2 = 0;
  while( true ) {
    uVar2 = std::numeric_limits<unsigned_short>::max();
    bVar1 = false;
    if (i_2 < (int)(uint)uVar2) {
      iVar4 = DescriptorProto::field_size((DescriptorProto *)parent_local);
      bVar1 = false;
      if (i_2 < iVar4) {
        pFVar13 = DescriptorProto::field((DescriptorProto *)parent_local,i_2);
        iVar5 = FieldDescriptorProto::number(pFVar13);
        bVar1 = iVar5 == i_2 + 1;
      }
    }
    if (!bVar1) break;
    *(short *)((long)&(alloc_local->
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ).pointers_.payload_.super_Base<char>.value + 4) = (short)i_2 + 1;
    i_2 = i_2 + 1;
  }
  iVar4 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::FeatureSet>.value = iVar4;
  iVar4 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local);
  pEVar14 = (PointerT<google::protobuf::ExtensionRangeOptions>)
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::OneofDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar4);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value = pEVar14;
  for (i_3 = 0; iVar4 = DescriptorProto::oneof_decl_size((DescriptorProto *)parent_local),
      i_3 < iVar4; i_3 = i_3 + 1) {
    proto_01 = DescriptorProto::oneof_decl((DescriptorProto *)parent_local,i_3);
    BuildOneof(this,proto_01,(Descriptor *)alloc_local,
               (OneofDescriptor *)
               ((long)&((alloc_local->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.
                       value)->super_Message + (long)i_3 * 0x38),alloc);
  }
  iVar4 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  *(int *)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.
           super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .value = iVar4;
  iVar4 = DescriptorProto::field_size((DescriptorProto *)parent_local);
  pEVar15 = (PointerT<google::protobuf::EnumValueOptions>)
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar4);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::EnumValueOptions>.value = pEVar15;
  for (i_4 = 0; iVar4 = DescriptorProto::field_size((DescriptorProto *)parent_local), i_4 < iVar4;
      i_4 = i_4 + 1) {
    pFVar13 = DescriptorProto::field((DescriptorProto *)parent_local,i_4);
    BuildField(this,pFVar13,(Descriptor *)alloc_local,
               (FieldDescriptor *)
               ((long)&((alloc_local->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ).pointers_.payload_.super_Base<google::protobuf::EnumValueOptions>.value)->
                       super_Message + (long)i_4 * 0x58),alloc);
  }
  iVar4 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::EnumOptions>.value = iVar4;
  iVar4 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local);
  pEVar16 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar4);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::ServiceOptions>.value =
       (PointerT<google::protobuf::ServiceOptions>)pEVar16;
  for (i_5 = 0; iVar4 = DescriptorProto::enum_type_size((DescriptorProto *)parent_local),
      i_5 < iVar4; i_5 = i_5 + 1) {
    proto_02 = DescriptorProto::enum_type((DescriptorProto *)parent_local,i_5);
    BuildEnum(this,proto_02,(Descriptor *)alloc_local,
              (EnumDescriptor *)
              ((alloc_local->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<google::protobuf::ServiceOptions>.value + i_5),alloc)
    ;
  }
  iVar4 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::EnumValueOptions>.value = iVar4;
  iVar4 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local);
  pMVar17 = (PointerT<google::protobuf::MethodOptions>)
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar4);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::MethodOptions>.value = pMVar17;
  for (i_6 = 0; iVar4 = DescriptorProto::extension_range_size((DescriptorProto *)parent_local),
      i_6 < iVar4; i_6 = i_6 + 1) {
    pDVar18 = DescriptorProto::extension_range((DescriptorProto *)parent_local,i_6);
    BuildExtensionRange(this,pDVar18,(Descriptor *)alloc_local,
                        (ExtensionRange *)
                        ((long)&((alloc_local->
                                 super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                 ).pointers_.payload_.super_Base<google::protobuf::MethodOptions>.
                                value)->super_Message + (long)i_6 * 0x28),alloc);
  }
  iVar4 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value = iVar4;
  iVar4 = DescriptorProto::extension_size((DescriptorProto *)parent_local);
  pFVar19 = (PointerT<google::protobuf::FileOptions>)
            anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar4);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FileOptions>.value = pFVar19;
  for (local_d0 = 0; iVar4 = DescriptorProto::extension_size((DescriptorProto *)parent_local),
      local_d0 < iVar4; local_d0 = local_d0 + 1) {
    pFVar13 = DescriptorProto::extension((DescriptorProto *)parent_local,local_d0);
    BuildExtension(this,pFVar13,(Descriptor *)alloc_local,
                   (FieldDescriptor *)
                   ((long)&((alloc_local->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                            ).pointers_.payload_.super_Base<google::protobuf::FileOptions>.value)->
                           super_Message + (long)local_d0 * 0x58),alloc);
  }
  iVar4 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).total_.payload_.super_Base<google::protobuf::OneofOptions>.value = iVar4;
  iVar4 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
  pRVar20 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::Descriptor::ReservedRange>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar4);
  *(ReservedRange **)
   &(alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_ = pRVar20;
  for (local_d4 = 0; iVar4 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local),
      pDVar22 = parent_local, descriptor = alloc_local, local_d4 < iVar4; local_d4 = local_d4 + 1) {
    pDVar21 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,local_d4);
    BuildReservedRange(this,pDVar21,(Descriptor *)alloc_local,
                       (ReservedRange *)
                       (*(long *)&(alloc_local->
                                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                  ).total_.payload_ + (long)local_d4 * 8),alloc);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&revert,
             "google.protobuf.MessageOptions");
  AllocateOptions<google::protobuf::Descriptor>
            (this,(Proto *)pDVar22,(Descriptor *)descriptor,7,_revert,alloc);
  this->recursion_depth_ = this->recursion_depth_ + -1;
  local_f0.to_increment = &this->recursion_depth_;
  if (this->recursion_depth_ < 1) {
    local_100 = Descriptor::full_name((Descriptor *)alloc_local);
    AddError(this,local_100,(Message *)parent_local,OTHER,
             "Reached maximum recursion limit for nested messages.");
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).pointers_.payload_.super_Base<google::protobuf::OneofOptions>.value =
         (PointerT<google::protobuf::OneofOptions>)0x0;
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_.super_Base<google::protobuf::FieldOptions>.value = 0;
    reserved_name_count = 1;
  }
  else {
    iVar4 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_.super_Base<google::protobuf::FieldOptions>.value = iVar4;
    iVar4 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local);
    pDVar22 = anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::Descriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar4);
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).pointers_.payload_.super_Base<google::protobuf::OneofOptions>.value =
         (PointerT<google::protobuf::OneofOptions>)pDVar22;
    for (i_8 = 0; iVar4 = i_8,
        iVar6 = DescriptorProto::nested_type_size((DescriptorProto *)parent_local), iVar4 < iVar6;
        i_8 = i_8 + 1) {
      proto_03 = DescriptorProto::nested_type((DescriptorProto *)parent_local,i_8);
      BuildMessage(this,proto_03,(Descriptor *)alloc_local,
                   (Descriptor *)
                   ((alloc_local->
                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    ).pointers_.payload_.super_Base<google::protobuf::OneofOptions>.value +
                   (long)i_8 * 2),alloc);
    }
    local_118 = DescriptorProto::reserved_name_size((DescriptorProto *)parent_local);
    (alloc_local->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).total_.payload_.super_Base<google::protobuf::ServiceOptions>.value = local_118;
    ppbVar23 = protobuf::(anonymous_namespace)::
               FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
               ::AllocateArray<std::__cxx11::string_const*>
                         ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                           *)alloc,local_118);
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
     &(alloc_local->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).total_.payload_.super_Base<google::protobuf::SourceCodeInfo> = ppbVar23;
    for (local_11c = 0; local_11c < local_118; local_11c = local_11c + 1) {
      psVar9 = DescriptorProto::reserved_name_abi_cxx11_((DescriptorProto *)parent_local,local_11c);
      psVar9 = protobuf::(anonymous_namespace)::
               FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
               ::AllocateStrings<std::__cxx11::string_const&>
                         ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                           *)alloc,psVar9);
      *(string **)
       (*(long *)&(alloc_local->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ).total_.payload_.super_Base<google::protobuf::SourceCodeInfo> +
       (long)local_11c * 8) = psVar9;
    }
    local_130 = Descriptor::full_name((Descriptor *)alloc_local);
    pDVar22 = result_local;
    local_140 = Descriptor::name((Descriptor *)alloc_local);
    proto_00 = parent_local;
    Symbol::Symbol(&stack0xfffffffffffffeb8,(Descriptor *)alloc_local);
    AddSymbol(this,local_130,pDVar22,local_140,(Message *)proto_00,SStack_148);
    range1._4_4_ = 0;
    while( true ) {
      iVar4 = range1._4_4_;
      iVar6 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
      if (iVar6 <= iVar4) break;
      pDStack_158 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range1._4_4_);
      range2._4_4_ = range1._4_4_;
      while( true ) {
        range2._4_4_ = range2._4_4_ + 1;
        iVar4 = range2._4_4_;
        iVar6 = DescriptorProto::reserved_range_size((DescriptorProto *)parent_local);
        if (iVar6 <= iVar4) break;
        local_168.p = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range2._4_4_);
        iVar5 = DescriptorProto_ReservedRange::end(pDStack_158);
        iVar7 = DescriptorProto_ReservedRange::start((DescriptorProto_ReservedRange *)local_168.p);
        if (iVar7 < iVar5) {
          iVar5 = DescriptorProto_ReservedRange::end((DescriptorProto_ReservedRange *)local_168.p);
          iVar7 = DescriptorProto_ReservedRange::start(pDStack_158);
          if (iVar7 < iVar5) {
            sVar25 = Descriptor::full_name((Descriptor *)alloc_local);
            local_178 = sVar25;
            pDVar21 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range1._4_4_);
            reserved_name_set.
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array = local_168;
            absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_188,
                       (anon_class_16_2_65e56138 *)
                       ((long)&reserved_name_set.
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8));
            make_error.invoker_ = p_Stack_180;
            make_error.ptr_.obj = local_188.obj;
            AddError(this,local_178,&pDVar21->super_Message,NUMBER,make_error);
          }
        }
      }
      range1._4_4_ = range1._4_4_ + 1;
    }
    absl::lts_20250127::
    flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&__range2);
    this_00 = DescriptorProto::reserved_name_abi_cxx11_((DescriptorProto *)parent_local);
    __end2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(this_00);
    name = (string *)
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(this_00);
    while( true ) {
      bVar1 = internal::operator!=(&__end2,(iterator *)&name);
      if (!bVar1) break;
      local_1d8 = internal::
                  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_1f0,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&__range2,local_1d8);
      if (((local_1f0.second ^ 0xffU) & 1) != 0) {
        sVar25 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d8);
        pDVar22 = parent_local;
        aStack_218.name = local_1d8;
        local_200 = sVar25;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_210,&stack0xfffffffffffffde8);
        make_error_00.invoker_ = p_Stack_208;
        make_error_00.ptr_.obj = local_210.obj;
        AddError(this,local_200,(Message *)pDVar22,NAME,make_error_00);
      }
      internal::
      RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    field._4_4_ = 0;
    while( true ) {
      iVar4 = field._4_4_;
      iVar6 = Descriptor::field_count((Descriptor *)alloc_local);
      if (iVar6 <= iVar4) break;
      pFStack_228 = Descriptor::field((Descriptor *)alloc_local,field._4_4_);
      range._4_4_ = 0;
      while( true ) {
        iVar4 = range._4_4_;
        iVar6 = Descriptor::extension_range_count((Descriptor *)alloc_local);
        if (iVar6 <= iVar4) break;
        local_238 = Descriptor::extension_range((Descriptor *)alloc_local,range._4_4_);
        iVar4 = Descriptor::ExtensionRange::start_number(local_238);
        iVar6 = FieldDescriptor::number(pFStack_228);
        if (iVar4 <= iVar6) {
          iVar4 = FieldDescriptor::number(pFStack_228);
          iVar6 = Descriptor::ExtensionRange::end_number(local_238);
          if (iVar4 < iVar6) {
            pMVar24 = absl::lts_20250127::container_internal::
                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                      ::
                      operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                                  *)&this->message_hints_,
                                 (key_arg<google::protobuf::Descriptor_*> *)&alloc_local);
            pDVar18 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range._4_4_);
            MessageHints::RequestHintOnFieldNumbers(pMVar24,&pDVar18->super_Message,NUMBER,0,1);
            sVar25 = FieldDescriptor::full_name(pFStack_228);
            local_248 = sVar25;
            pDVar18 = DescriptorProto::extension_range((DescriptorProto *)parent_local,range._4_4_);
            _auStack_268 = &local_238;
            local_260 = &stack0xfffffffffffffdd8;
            absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_258,
                       (anon_class_16_2_b8514d46 *)auStack_268);
            make_error_01.invoker_ = p_Stack_250;
            make_error_01.ptr_.obj = local_258.obj;
            AddError(this,local_248,&pDVar18->super_Message,NUMBER,make_error_01);
          }
        }
        range._4_4_ = range._4_4_ + 1;
      }
      range_1._4_4_ = 0;
      while( true ) {
        iVar4 = range_1._4_4_;
        iVar6 = Descriptor::reserved_range_count((Descriptor *)alloc_local);
        if (iVar6 <= iVar4) break;
        local_278 = Descriptor::reserved_range((Descriptor *)alloc_local,range_1._4_4_);
        iVar4 = local_278->start;
        iVar6 = FieldDescriptor::number(pFStack_228);
        if (iVar4 <= iVar6) {
          iVar4 = FieldDescriptor::number(pFStack_228);
          if (iVar4 < local_278->end) {
            pMVar24 = absl::lts_20250127::container_internal::
                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                      ::
                      operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                                  *)&this->message_hints_,
                                 (key_arg<google::protobuf::Descriptor_*> *)&alloc_local);
            pDVar21 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range_1._4_4_)
            ;
            MessageHints::RequestHintOnFieldNumbers(pMVar24,&pDVar21->super_Message,NUMBER,0,1);
            sVar25 = FieldDescriptor::full_name(pFStack_228);
            local_288 = sVar25;
            pDVar21 = DescriptorProto::reserved_range((DescriptorProto *)parent_local,range_1._4_4_)
            ;
            local_2a0.field = &stack0xfffffffffffffdd8;
            absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_298,&local_2a0);
            make_error_02.invoker_ = p_Stack_290;
            make_error_02.ptr_.obj = local_298.obj;
            AddError(this,local_288,&pDVar21->super_Message,NUMBER,make_error_02);
          }
        }
        range_1._4_4_ = range_1._4_4_ + 1;
      }
      sVar25 = FieldDescriptor::name(pFStack_228);
      local_2b0 = sVar25;
      bVar1 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::contains<std::basic_string_view<char,std::char_traits<char>>>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)&__range2,&local_2b0);
      if (bVar1) {
        sVar25 = FieldDescriptor::full_name(pFStack_228);
        local_2c0 = sVar25;
        pFVar13 = DescriptorProto::field((DescriptorProto *)parent_local,field._4_4_);
        aStack_2d8.field = &stack0xfffffffffffffdd8;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_2d0,&stack0xfffffffffffffd28);
        make_error_03.invoker_ = p_Stack_2c8;
        make_error_03.ptr_.obj = local_2d0.obj;
        AddError(this,local_2c0,&pFVar13->super_Message,NAME,make_error_03);
      }
      field._4_4_ = field._4_4_ + 1;
    }
    range1_1._4_4_ = 0;
    while( true ) {
      iVar4 = range1_1._4_4_;
      iVar6 = Descriptor::extension_range_count((Descriptor *)alloc_local);
      if (iVar6 <= iVar4) break;
      pEStack_2e8 = Descriptor::extension_range((Descriptor *)alloc_local,range1_1._4_4_);
      range2_1._4_4_ = 0;
      while( true ) {
        iVar6 = range2_1._4_4_;
        iVar8 = Descriptor::reserved_range_count((Descriptor *)alloc_local);
        iVar4 = range1_1._4_4_;
        if (iVar8 <= iVar6) break;
        local_2f8 = Descriptor::reserved_range((Descriptor *)alloc_local,range2_1._4_4_);
        iVar4 = Descriptor::ExtensionRange::end_number(pEStack_2e8);
        if (local_2f8->start < iVar4) {
          iVar4 = local_2f8->end;
          iVar6 = Descriptor::ExtensionRange::start_number(pEStack_2e8);
          if (iVar6 < iVar4) {
            sVar25 = Descriptor::full_name((Descriptor *)alloc_local);
            local_308 = sVar25;
            pDVar18 = DescriptorProto::extension_range
                                ((DescriptorProto *)parent_local,range1_1._4_4_);
            _auStack_328 = &stack0xfffffffffffffd18;
            local_320 = &local_2f8;
            absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_318,
                       (anon_class_16_2_65e5611a *)auStack_328);
            make_error_04.invoker_ = p_Stack_310;
            make_error_04.ptr_.obj = local_318.obj;
            AddError(this,local_308,&pDVar18->super_Message,NUMBER,make_error_04);
          }
        }
        range2_1._4_4_ = range2_1._4_4_ + 1;
      }
      while( true ) {
        range2_2._4_4_ = iVar4 + 1;
        iVar4 = range2_2._4_4_;
        iVar6 = Descriptor::extension_range_count((Descriptor *)alloc_local);
        if (iVar6 <= iVar4) break;
        local_338 = Descriptor::extension_range((Descriptor *)alloc_local,range2_2._4_4_);
        iVar6 = Descriptor::ExtensionRange::end_number(pEStack_2e8);
        iVar8 = Descriptor::ExtensionRange::start_number(local_338);
        iVar4 = range2_2._4_4_;
        if (iVar8 < iVar6) {
          iVar6 = Descriptor::ExtensionRange::end_number(local_338);
          iVar8 = Descriptor::ExtensionRange::start_number(pEStack_2e8);
          iVar4 = range2_2._4_4_;
          if (iVar8 < iVar6) {
            sVar25 = Descriptor::full_name((Descriptor *)alloc_local);
            local_348 = sVar25;
            pDVar18 = DescriptorProto::extension_range
                                ((DescriptorProto *)parent_local,range1_1._4_4_);
            local_368.range2 = &local_338;
            local_368.range1 = &stack0xfffffffffffffd18;
            absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,void>
                      ((FunctionRef<std::__cxx11::string()> *)&local_358,&local_368);
            make_error_05.invoker_ = p_Stack_350;
            make_error_05.ptr_.obj = local_358.obj;
            AddError(this,local_348,&pDVar18->super_Message,NUMBER,make_error_05);
            iVar4 = range2_2._4_4_;
          }
        }
      }
      range1_1._4_4_ = range1_1._4_4_ + 1;
    }
    absl::lts_20250127::
    flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~flat_hash_set((flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&__range2);
    reserved_name_count = 0;
  }
  anon_unknown_24::IncrementWhenDestroyed::~IncrementWhenDestroyed(&local_f0);
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}